

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

s3wid_t dict_add_word(dict_t *d,char *word,s3cipid_t *p,int32 np)

{
  dictword_t *pdVar1;
  s3cipid_t *__src;
  int32 iVar2;
  int iVar3;
  dictword_t *pdVar4;
  char *pcVar5;
  void *pvVar6;
  s3cipid_t *__dest;
  undefined4 in_register_0000000c;
  int32 w;
  int local_44;
  s3cipid_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000000c,np);
  iVar3 = d->n_word;
  local_40 = p;
  if (iVar3 < d->max_words) {
    pdVar4 = d->word;
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x56,"Reallocating to %d KiB for word entries\n",
            (long)d->max_words + 0x1000U >> 5 & 0x3fffffffffffff);
    pdVar4 = (dictword_t *)
             __ckd_realloc__(d->word,(long)d->max_words * 0x20 + 0x20000,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                             ,0x5a);
    d->word = pdVar4;
    d->max_words = d->max_words + 0x1000;
    iVar3 = d->n_word;
  }
  pdVar1 = pdVar4 + iVar3;
  pcVar5 = __ckd_salloc__(word,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0x5f);
  pdVar4[iVar3].word = pcVar5;
  pcVar5 = __ckd_salloc__(word,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0x62);
  iVar2 = dict_word2basestr(pcVar5);
  if (iVar2 < 1) {
    pdVar1->alt = -1;
    pdVar1->basewid = d->n_word;
  }
  else {
    iVar2 = hash_table_lookup_int32(d->ht,pcVar5,&local_44);
    if (iVar2 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0x68,"Missing base word for: %s\n",word);
      ckd_free(pcVar5);
      goto LAB_001094e9;
    }
    pdVar1->basewid = local_44;
    pdVar4 = d->word;
    pdVar1->alt = pdVar4[local_44].alt;
    pdVar4[local_44].alt = d->n_word;
  }
  ckd_free(pcVar5);
  pvVar6 = hash_table_enter(d->ht,pdVar1->word,(void *)(long)d->n_word);
  __src = local_40;
  iVar3 = (int)pvVar6;
  if (d->n_word == iVar3) {
    iVar2 = (int32)local_38;
    if (iVar2 < 1 || local_40 == (s3cipid_t *)0x0) {
      pdVar1->ciphone = (s3cipid_t *)0x0;
      iVar2 = 0;
    }
    else {
      __dest = (s3cipid_t *)
               __ckd_malloc__((ulong)(uint)(iVar2 * 2),
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                              ,0x82);
      pdVar1->ciphone = __dest;
      memcpy(__dest,__src,(ulong)(uint)(iVar2 * 2));
      iVar3 = d->n_word;
    }
    pdVar1->pronlen = iVar2;
    d->n_word = iVar3 + 1;
    return iVar3;
  }
LAB_001094e9:
  ckd_free(pdVar1->word);
  pdVar1->word = (char *)0x0;
  return -1;
}

Assistant:

s3wid_t
dict_add_word(dict_t * d, char const *word, s3cipid_t const * p, int32 np)
{
    int32 len;
    dictword_t *wordp;
    s3wid_t newwid;
    char *wword;

    if (d->n_word >= d->max_words) {
        E_INFO("Reallocating to %d KiB for word entries\n",
               (d->max_words + S3DICT_INC_SZ) * sizeof(dictword_t) / 1024);
        d->word =
            (dictword_t *) ckd_realloc(d->word,
                                       (d->max_words +
                                        S3DICT_INC_SZ) * sizeof(dictword_t));
        d->max_words = d->max_words + S3DICT_INC_SZ;
    }

    wordp = d->word + d->n_word;
    wordp->word = (char *) ckd_salloc(word);    /* Freed in dict_free */

    /* Determine base/alt wids */
    wword = ckd_salloc(word);
    if ((len = dict_word2basestr(wword)) > 0) {
        int32 w;

        /* Truncated to a baseword string; find its ID */
        if (hash_table_lookup_int32(d->ht, wword, &w) < 0) {
            E_ERROR("Missing base word for: %s\n", word);
            ckd_free(wword);
            ckd_free(wordp->word);
            wordp->word = NULL;
            return BAD_S3WID;
        }

        /* Link into alt list */
        wordp->basewid = w;
        wordp->alt = d->word[w].alt;
        d->word[w].alt = d->n_word;
    } else {
        wordp->alt = BAD_S3WID;
        wordp->basewid = d->n_word;
    }
    ckd_free(wword);

    /* Associate word string with d->n_word in hash table */
    if (hash_table_enter_int32(d->ht, wordp->word, d->n_word) != d->n_word) {
        ckd_free(wordp->word);
        wordp->word = NULL;
        return BAD_S3WID;
    }

    /* Fill in word entry, and set defaults */
    if (p && (np > 0)) {
        wordp->ciphone = (s3cipid_t *) ckd_malloc(np * sizeof(s3cipid_t));      /* Freed in dict_free */
        memcpy(wordp->ciphone, p, np * sizeof(s3cipid_t));
        wordp->pronlen = np;
    }
    else {
        wordp->ciphone = NULL;
        wordp->pronlen = 0;
    }

    newwid = d->n_word++;

    return newwid;
}